

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::SocketWriter::~SocketWriter(SocketWriter *this)

{
  SocketWriter *this_local;
  
  (this->super_AbstractSocketWriter)._vptr_AbstractSocketWriter =
       (_func_int **)&PTR__SocketWriter_002086e0;
  if (this->sockfd_ != -1) {
    (*(this->super_AbstractSocketWriter)._vptr_AbstractSocketWriter[3])();
  }
  std::__cxx11::string::~string((string *)&this->port_num_);
  std::__cxx11::string::~string((string *)&this->host_name_);
  AbstractSocketWriter::~AbstractSocketWriter(&this->super_AbstractSocketWriter);
  return;
}

Assistant:

virtual ~SocketWriter() {
      if (sockfd_ != -1)
        CloseConnection();
    }